

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.hpp
# Opt level: O2

type __thiscall
jsoncons::detail::to_integer_unchecked<long,char>(detail *this,char *s,size_t length,long *n)

{
  detail dVar1;
  assertion_error *this_00;
  undefined4 uVar2;
  detail *pdVar3;
  long lVar4;
  long lVar5;
  type tVar6;
  allocator<char> local_31;
  string local_30;
  
  if (s == (char *)0x0) {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"assertion \'length > 0\' failed at  <> :0",&local_31);
    assertion_error::assertion_error(this_00,&local_30);
    __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined8 *)length = 0;
  pdVar3 = (detail *)(s + (long)this);
  if (*this == (detail)0x2d) {
    lVar4 = 0;
    for (this = this + 1; this < pdVar3; this = this + 1) {
      n = (long *)CONCAT71((int7)((ulong)n >> 8),1);
      uVar2 = SUB84(n,0);
      if (lVar4 < -0xccccccccccccccc) goto LAB_0019bb29;
      dVar1 = *this;
      lVar4 = lVar4 * 10;
      *(long *)length = lVar4;
      if (lVar4 < (long)(char)dVar1 + 0x7fffffffffffffd0) goto LAB_0019bb29;
      lVar4 = (lVar4 - (char)dVar1) + 0x30;
      *(long *)length = lVar4;
    }
  }
  else {
    lVar4 = 0;
    for (; this < pdVar3; this = this + 1) {
      n = (long *)CONCAT71((int7)((ulong)n >> 8),1);
      uVar2 = SUB84(n,0);
      if (0xccccccccccccccc < lVar4) goto LAB_0019bb29;
      dVar1 = *this;
      lVar4 = lVar4 * 10;
      *(long *)length = lVar4;
      lVar5 = -0x7fffffffffffffd1 - (long)(char)dVar1;
      if (lVar4 - lVar5 != 0 && lVar5 <= lVar4) goto LAB_0019bb29;
      lVar4 = (long)(char)dVar1 + -0x30 + lVar4;
      *(long *)length = lVar4;
    }
  }
  uVar2 = 0;
LAB_0019bb29:
  tVar6._8_4_ = uVar2;
  tVar6.ptr = (char *)this;
  tVar6._12_4_ = 0;
  return tVar6;
}

Assistant:

typename std::enable_if<ext_traits::integer_limits<T>::is_specialized && ext_traits::integer_limits<T>::is_signed,to_integer_result<T,CharT>>::type
to_integer_unchecked(const CharT* s, std::size_t length, T& n)
{
    static_assert(ext_traits::integer_limits<T>::is_specialized, "Integer type not specialized");
    JSONCONS_ASSERT(length > 0);

    n = 0;

    const CharT* end = s + length; 
    if (*s == '-')
    {
        static constexpr T min_value = (ext_traits::integer_limits<T>::lowest)();
        static constexpr T min_value_div_10 = min_value / 10;
        ++s;
        for (; s < end; ++s)
        {
            T x = (T)*s - (T)('0');
            if (n < min_value_div_10)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n = n * 10;
            if (n < min_value + x)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }

            n -= x;
        }
    }
    else
    {
        static constexpr T max_value = (ext_traits::integer_limits<T>::max)();
        static constexpr T max_value_div_10 = max_value / 10;
        for (; s < end; ++s)
        {
            T x = static_cast<T>(*s) - static_cast<T>('0');
            if (n > max_value_div_10)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n = n * 10;
            if (n > max_value - x)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }

            n += x;
        }
    }

    return to_integer_result<T,CharT>(s, to_integer_errc());
}